

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::ConfidentialTransaction::GetByteData
          (ByteData *__return_storage_ptr__,ConfidentialTransaction *this,bool has_witness)

{
  wally_tx *tx;
  wally_tx_output *pwVar1;
  wally_tx_witness_stack *pwVar2;
  wally_tx_witness_item *pwVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  ByteData *pBVar8;
  uint32_t *puVar9;
  uint32_t *puVar10;
  uint8_t *puVar11;
  CfdException *pCVar12;
  ulong uVar13;
  uint uVar14;
  undefined7 in_register_00000011;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  byte bVar18;
  uint32_t flags;
  size_type sVar19;
  size_t sVar20;
  uint uVar21;
  wally_tx_input *pwVar22;
  size_type local_90;
  bool has_witness_local;
  int ret;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_t txsize;
  int local_58;
  char *local_50;
  size_t *local_40;
  ByteData *local_38;
  
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  size = 0;
  flags = (uint32_t)CONCAT71(in_register_00000011,has_witness);
  has_witness_local = has_witness;
  local_38 = __return_storage_ptr__;
  ret = wally_tx_get_length(tx,flags,&size);
  if (ret != 0) {
    txsize = (long)
             "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
             + 0x67;
    local_58 = 0xe7b;
    local_50 = "GetByteData";
    logger::warn<int&,bool&>
              ((CfdSourceLocation *)&txsize,"wally_tx_get_length NG[{}]. wit[{}]",&ret,
               &has_witness_local);
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&txsize,"tx length calc error.",(allocator *)&buffer);
    CfdException::CfdException(pCVar12,kCfdIllegalStateError,(string *)&txsize);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ret = 0;
  if (size < 0xb) {
    ret = -2;
    txsize = (long)
             "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
             + 0x67;
    local_58 = 0xe82;
    local_50 = "GetByteData";
    logger::warn<unsigned_long&>((CfdSourceLocation *)&txsize,"tx size low.[{}]",&size);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buffer,size,(allocator_type *)&txsize);
  if (ret != -2) {
    txsize = size;
    ret = wally_tx_to_bytes(tx,flags,buffer.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                            (long)buffer.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)buffer.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,&txsize);
    if (ret == 0) goto LAB_003dd379;
    if (ret != -2) {
      txsize = (long)
               "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               + 0x67;
      local_58 = 0xf6c;
      local_50 = "GetByteData";
      logger::warn<int&>((CfdSourceLocation *)&txsize,"wally_tx_to_bytes NG[{}].",&ret);
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&txsize,"tx hex convert error.",(allocator *)&local_90);
      CfdException::CfdException(pCVar12,kCfdIllegalStateError,(string *)&txsize);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  local_40 = &tx->num_inputs;
  if ((tx->num_inputs != 0) && (tx->num_outputs != 0)) {
    txsize = (long)
             "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
             + 0x67;
    local_58 = 0xf67;
    local_50 = "GetByteData";
    logger::warn<int&,unsigned_long&,unsigned_long&>
              ((CfdSourceLocation *)&txsize,"wally_tx_to_bytes NG[{}]. in/out={}/{}",&ret,local_40,
               &tx->num_outputs);
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&txsize,"tx hex convert error.",(allocator *)&local_90)
    ;
    CfdException::CfdException(pCVar12,kCfdIllegalStateError,(string *)&txsize);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  txsize = (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
           + 0x67;
  local_58 = 0xe92;
  local_50 = "GetByteData";
  logger::info<unsigned_long&>((CfdSourceLocation *)&txsize,"wally_tx_get_length size[{}]",&size);
  uVar13 = tx->num_inputs;
  uVar17 = tx->num_outputs;
  local_90 = uVar17 * 0x70 + uVar13 * 0xd0 + 0x38;
  for (uVar14 = 0; uVar15 = (ulong)uVar14, uVar15 < uVar13; uVar14 = uVar14 + 1) {
    pwVar22 = tx->inputs;
    sVar19 = local_90 + 0x40;
    if (pwVar22[uVar15].issuance_amount != (uchar *)0x0) {
      sVar19 = pwVar22[uVar15].issuance_amount_len + local_90 + 0x4a;
    }
    local_90 = sVar19;
    if (pwVar22[uVar15].inflation_keys != (uchar *)0x0) {
      local_90 = sVar19 + pwVar22[uVar15].inflation_keys_len + 10;
    }
  }
  for (uVar14 = 0; uVar15 = (ulong)uVar14, uVar15 < uVar17; uVar14 = uVar14 + 1) {
    pwVar1 = tx->outputs;
    if (pwVar1[uVar15].asset != (uchar *)0x0) {
      local_90 = local_90 + pwVar1[uVar15].asset_len + 10;
    }
    if (pwVar1[uVar15].value != (uchar *)0x0) {
      local_90 = local_90 + pwVar1[uVar15].value_len + 10;
    }
    if (pwVar1[uVar15].nonce != (uchar *)0x0) {
      local_90 = local_90 + pwVar1[uVar15].nonce_len + 10;
    }
    if (pwVar1[uVar15].script != (uchar *)0x0) {
      local_90 = local_90 + pwVar1[uVar15].script_len + 10;
    }
    local_90 = local_90 + 10;
  }
  bVar7 = false;
  bVar18 = 0;
  for (uVar14 = 0; uVar15 = (ulong)uVar14, uVar15 < uVar13; uVar14 = uVar14 + 1) {
    pwVar22 = tx->inputs;
    if (pwVar22[uVar15].issuance_amount_rangeproof != (uchar *)0x0) {
      local_90 = local_90 + pwVar22[uVar15].issuance_amount_rangeproof_len + 10;
      bVar7 = true;
    }
    if (pwVar22[uVar15].inflation_keys_rangeproof != (uchar *)0x0) {
      local_90 = local_90 + pwVar22[uVar15].inflation_keys_rangeproof_len + 10;
      bVar7 = true;
    }
    pwVar2 = pwVar22[uVar15].witness;
    if (pwVar2 == (wally_tx_witness_stack *)0x0) {
      sVar20 = 0;
    }
    else {
      sVar20 = pwVar2->num_items;
    }
    for (uVar21 = 0; uVar21 < sVar20; uVar21 = uVar21 + 1) {
      local_90 = local_90 + pwVar2->items[uVar21].witness_len + 10;
      bVar18 = 1;
    }
    pwVar2 = pwVar22[uVar15].pegin_witness;
    if (pwVar2 == (wally_tx_witness_stack *)0x0) {
      sVar20 = 0;
    }
    else {
      sVar20 = pwVar2->num_items;
    }
    for (uVar21 = 0; uVar21 < sVar20; uVar21 = uVar21 + 1) {
      local_90 = local_90 + pwVar2->items[uVar21].witness_len + 10;
      bVar18 = 1;
    }
    local_90 = local_90 + 10;
  }
  bVar16 = 0;
  for (uVar14 = 0; uVar13 = (ulong)uVar14, uVar13 < uVar17; uVar14 = uVar14 + 1) {
    pwVar1 = tx->outputs;
    if (pwVar1[uVar13].surjectionproof != (uchar *)0x0) {
      local_90 = local_90 + pwVar1[uVar13].surjectionproof_len + 10;
      bVar16 = 1;
    }
    if (pwVar1[uVar13].rangeproof != (uchar *)0x0) {
      local_90 = local_90 + pwVar1[uVar13].rangeproof_len + 10;
      bVar16 = 1;
    }
    local_90 = local_90 + 10;
  }
  if ((ulong)((long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) < local_90) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buffer,local_90);
    txsize = (long)
             "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
             + 0x67;
    local_58 = 0xedb;
    local_50 = "GetByteData";
    logger::info<unsigned_long&>((CfdSourceLocation *)&txsize,"buffer.resize[{}]",&local_90);
  }
  *(uint32_t *)
   buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = tx->version;
  bVar18 = (bVar18 | bVar7 | bVar16) & (tx->version >> 0x1e & 1) == 0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = bVar18;
  puVar9 = (uint32_t *)
           AbstractTransaction::CopyVariableInt
                     (tx->num_inputs,
                      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 5);
  for (uVar14 = 0; uVar13 = (ulong)uVar14, uVar13 < *local_40; uVar14 = uVar14 + 1) {
    pwVar22 = tx->inputs;
    uVar21 = pwVar22[uVar13].index;
    if ((pwVar22[uVar13].pegin_witness != (wally_tx_witness_stack *)0x0) &&
       ((pwVar22[uVar13].pegin_witness)->num_items != 0)) {
      uVar21 = uVar21 | 0x40000000;
    }
    pwVar22 = pwVar22 + uVar13;
    if ((pwVar22->issuance_amount != (uchar *)0x0) && (pwVar22->issuance_amount_len != 0)) {
      uVar21 = uVar21 | 0x80000000;
    }
    uVar4 = *(undefined8 *)pwVar22->txhash;
    uVar5 = *(undefined8 *)(pwVar22->txhash + 8);
    uVar6 = *(undefined8 *)(pwVar22->txhash + 0x18);
    *(undefined8 *)(puVar9 + 4) = *(undefined8 *)(pwVar22->txhash + 0x10);
    *(undefined8 *)(puVar9 + 6) = uVar6;
    *(undefined8 *)puVar9 = uVar4;
    *(undefined8 *)(puVar9 + 2) = uVar5;
    puVar9[8] = uVar21;
    puVar10 = (uint32_t *)
              AbstractTransaction::CopyVariableBuffer
                        (pwVar22->script,pwVar22->script_len,(uint8_t *)(puVar9 + 9));
    *puVar10 = pwVar22->sequence;
    puVar9 = puVar10 + 1;
    if (bVar7) {
      uVar4 = *(undefined8 *)pwVar22->blinding_nonce;
      uVar5 = *(undefined8 *)(pwVar22->blinding_nonce + 8);
      uVar6 = *(undefined8 *)(pwVar22->blinding_nonce + 0x18);
      *(undefined8 *)(puVar10 + 5) = *(undefined8 *)(pwVar22->blinding_nonce + 0x10);
      *(undefined8 *)(puVar10 + 7) = uVar6;
      *(undefined8 *)puVar9 = uVar4;
      *(undefined8 *)(puVar10 + 3) = uVar5;
      uVar4 = *(undefined8 *)pwVar22->entropy;
      uVar5 = *(undefined8 *)(pwVar22->entropy + 8);
      uVar6 = *(undefined8 *)(pwVar22->entropy + 0x18);
      *(undefined8 *)(puVar10 + 0xd) = *(undefined8 *)(pwVar22->entropy + 0x10);
      *(undefined8 *)(puVar10 + 0xf) = uVar6;
      *(undefined8 *)(puVar10 + 9) = uVar4;
      *(undefined8 *)(puVar10 + 0xb) = uVar5;
      puVar11 = CopyConfidentialCommitment
                          (pwVar22->issuance_amount,pwVar22->issuance_amount_len,9,
                           (uint8_t *)(puVar10 + 0x11));
      puVar9 = (uint32_t *)
               CopyConfidentialCommitment
                         (pwVar22->inflation_keys,pwVar22->inflation_keys_len,9,puVar11);
    }
  }
  puVar9 = (uint32_t *)AbstractTransaction::CopyVariableInt(tx->num_outputs,(uint8_t *)puVar9);
  for (uVar14 = 0; uVar13 = (ulong)uVar14, uVar13 < tx->num_outputs; uVar14 = uVar14 + 1) {
    pwVar1 = tx->outputs;
    puVar11 = CopyConfidentialCommitment
                        (pwVar1[uVar13].asset,pwVar1[uVar13].asset_len,0x21,(uint8_t *)puVar9);
    puVar11 = CopyConfidentialCommitment(pwVar1[uVar13].value,pwVar1[uVar13].value_len,9,puVar11);
    puVar11 = CopyConfidentialCommitment(pwVar1[uVar13].nonce,pwVar1[uVar13].nonce_len,0x21,puVar11)
    ;
    puVar9 = (uint32_t *)
             AbstractTransaction::CopyVariableBuffer
                       (pwVar1[uVar13].script,pwVar1[uVar13].script_len,puVar11);
  }
  *puVar9 = tx->locktime;
  puVar9 = puVar9 + 1;
  if (bVar18 != 0) {
    for (uVar14 = 0; uVar13 = (ulong)uVar14, uVar13 < *local_40; uVar14 = uVar14 + 1) {
      pwVar22 = tx->inputs;
      puVar11 = AbstractTransaction::CopyVariableBuffer
                          (pwVar22[uVar13].issuance_amount_rangeproof,
                           pwVar22[uVar13].issuance_amount_rangeproof_len,(uint8_t *)puVar9);
      puVar11 = AbstractTransaction::CopyVariableBuffer
                          (pwVar22[uVar13].inflation_keys_rangeproof,
                           pwVar22[uVar13].inflation_keys_rangeproof_len,puVar11);
      if (pwVar22[uVar13].witness == (wally_tx_witness_stack *)0x0) {
        sVar20 = 0;
      }
      else {
        sVar20 = (pwVar22[uVar13].witness)->num_items;
      }
      puVar11 = AbstractTransaction::CopyVariableInt(sVar20,puVar11);
      for (uVar21 = 0; uVar17 = (ulong)uVar21, uVar17 < sVar20; uVar21 = uVar21 + 1) {
        pwVar3 = (pwVar22[uVar13].witness)->items;
        puVar11 = AbstractTransaction::CopyVariableBuffer
                            (pwVar3[uVar17].witness,pwVar3[uVar17].witness_len,puVar11);
      }
      if (pwVar22[uVar13].pegin_witness == (wally_tx_witness_stack *)0x0) {
        sVar20 = 0;
      }
      else {
        sVar20 = (pwVar22[uVar13].pegin_witness)->num_items;
      }
      puVar9 = (uint32_t *)AbstractTransaction::CopyVariableInt(sVar20,puVar11);
      for (uVar21 = 0; uVar17 = (ulong)uVar21, uVar17 < sVar20; uVar21 = uVar21 + 1) {
        pwVar3 = (pwVar22[uVar13].pegin_witness)->items;
        puVar9 = (uint32_t *)
                 AbstractTransaction::CopyVariableBuffer
                           (pwVar3[uVar17].witness,pwVar3[uVar17].witness_len,(uint8_t *)puVar9);
      }
    }
    for (uVar14 = 0; uVar13 = (ulong)uVar14, uVar13 < tx->num_outputs; uVar14 = uVar14 + 1) {
      pwVar1 = tx->outputs;
      puVar11 = AbstractTransaction::CopyVariableBuffer
                          (pwVar1[uVar13].surjectionproof,pwVar1[uVar13].surjectionproof_len,
                           (uint8_t *)puVar9);
      puVar9 = (uint32_t *)
               AbstractTransaction::CopyVariableBuffer
                         (pwVar1[uVar13].rangeproof,pwVar1[uVar13].rangeproof_len,puVar11);
    }
  }
  size = (long)puVar9 -
         (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  if (size < (ulong)((long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start)) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buffer,size);
    txsize = (long)
             "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
             + 0x67;
    local_58 = 0xf63;
    local_50 = "GetByteData";
    logger::info<unsigned_long&>((CfdSourceLocation *)&txsize,"set buffer size[{}]",&size);
  }
LAB_003dd379:
  pBVar8 = local_38;
  ByteData::ByteData(local_38,&buffer);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return pBVar8;
}

Assistant:

ByteData ConfidentialTransaction::GetByteData(bool has_witness) const {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  size_t size = 0;
  uint32_t flag = 0;
  if (has_witness) {
    flag = WALLY_TX_FLAG_USE_WITNESS;
  }

  int ret = wally_tx_get_length(tx_pointer, flag, &size);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_get_length NG[{}]. wit[{}]", ret,
        has_witness);
    throw CfdException(kCfdIllegalStateError, "tx length calc error.");
  }
  // info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
  if (size < kElementsTransactionMinimumSize) {
    ret = WALLY_EINVAL;
    warn(CFD_LOG_SOURCE, "tx size low.[{}]", size);
  }
  std::vector<uint8_t> buffer(size);
  if (ret != WALLY_EINVAL) {
    size_t txsize = size;
    // flag |= WALLY_TX_FLAG_USE_ELEMENTS;
    ret = wally_tx_to_bytes(
        tx_pointer, flag, buffer.data(), buffer.size(), &txsize);
  }
  if (ret == WALLY_EINVAL) {
    /* About conversion with object.
     * In libwally, txin / txout does not allow empty data.
     * Therefore, if txin / txout is empty, object to byte is an error.
     * Therefore, it performs its own processing under certain circumstances.
     */
    if ((tx_pointer->num_inputs == 0) || (tx_pointer->num_outputs == 0)) {
      info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
      bool has_txin_witness = false;
      bool has_txin_rangeproof = false;
      bool has_txout_witness = false;
      bool is_witness = false;
      // Necessary size calculation because wally_tx_get_length may be
      // an invalid value (reserved more)
      size_t need_size = sizeof(struct wally_tx);
      need_size += tx_pointer->num_inputs * sizeof(struct wally_tx_input);
      need_size += tx_pointer->num_outputs * sizeof(struct wally_tx_output);
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        need_size += sizeof(input->blinding_nonce);
        need_size += sizeof(input->entropy);
        if (input->issuance_amount) {
          need_size += input->issuance_amount_len + 10;
        }
        if (input->inflation_keys) {
          need_size += input->inflation_keys_len + 10;
        }
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->asset) need_size += output->asset_len + 10;
        if (output->value) need_size += output->value_len + 10;
        if (output->nonce) need_size += output->nonce_len + 10;
        if (output->script) need_size += output->script_len + 10;
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        // issuance amount range proof
        if (input->issuance_amount_rangeproof) {
          need_size += input->issuance_amount_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // inflation keys range proof
        if (input->inflation_keys_rangeproof) {
          need_size += input->inflation_keys_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // witness
        size_t num_items = input->witness ? input->witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        // pegin_witness
        num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->pegin_witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->surjectionproof) {
          need_size += output->surjectionproof_len + 10;
          has_txout_witness = true;
        }
        if (output->rangeproof) {
          need_size += output->rangeproof_len + 10;
          has_txout_witness = true;
        }
        need_size += 10;
      }
      if (need_size > buffer.size()) {
        buffer.resize(need_size);
        info(CFD_LOG_SOURCE, "buffer.resize[{}]", need_size);
      }

      uint8_t *address_pointer = buffer.data();
      memcpy(
          address_pointer, &tx_pointer->version, sizeof(tx_pointer->version));
      address_pointer += sizeof(tx_pointer->version);
      uint8_t witness_flag = 0;
      if ((tx_pointer->version & kTransactionVersionNoWitness) == 0) {
        if (has_txin_witness || has_txin_rangeproof || has_txout_witness) {
          is_witness = true;
          witness_flag = 1;
        }
      }
      *address_pointer = witness_flag;
      ++address_pointer;

      // txin
      address_pointer =
          CopyVariableInt(tx_pointer->num_inputs, address_pointer);
      uint32_t temp_index;
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        temp_index = input->index;
        if (input->pegin_witness && (input->pegin_witness->num_items > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_PEGIN_FLAG);
        }
        if (input->issuance_amount && (input->issuance_amount_len > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_ISSUANCE_FLAG);
        }
        memcpy(address_pointer, input->txhash, sizeof(input->txhash));
        address_pointer += sizeof(input->txhash);
        memcpy(address_pointer, &temp_index, sizeof(temp_index));
        address_pointer += sizeof(temp_index);
        address_pointer = CopyVariableBuffer(
            input->script, input->script_len, address_pointer);
        memcpy(address_pointer, &input->sequence, sizeof(input->sequence));
        address_pointer += sizeof(input->sequence);
        if (has_txin_rangeproof) {
          // blinding_nonce
          memcpy(
              address_pointer, &input->blinding_nonce,
              sizeof(input->blinding_nonce));
          address_pointer += sizeof(input->blinding_nonce);
          // entropy
          memcpy(address_pointer, &input->entropy, sizeof(input->entropy));
          address_pointer += sizeof(input->entropy);
          // issuance amount
          address_pointer = CopyConfidentialCommitment(
              input->issuance_amount, input->issuance_amount_len,
              kConfidentialValueSize, address_pointer);
          // inflation keys
          address_pointer = CopyConfidentialCommitment(
              input->inflation_keys, input->inflation_keys_len,
              kConfidentialValueSize, address_pointer);
        }
      }

      // txout
      address_pointer =
          CopyVariableInt(tx_pointer->num_outputs, address_pointer);
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        // asset (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->asset, output->asset_len, kConfidentialDataSize,
            address_pointer);
        // value (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->value, output->value_len, kConfidentialValueSize,
            address_pointer);
        // nonce (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->nonce, output->nonce_len, kConfidentialDataSize,
            address_pointer);
        // script
        address_pointer = CopyVariableBuffer(
            output->script, output->script_len, address_pointer);
      }

      // locktime
      memcpy(
          address_pointer, &tx_pointer->locktime,
          sizeof(tx_pointer->locktime));
      address_pointer += sizeof(tx_pointer->locktime);

      // witness
      if (is_witness) {
        for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
          const struct wally_tx_input *input = tx_pointer->inputs + i;
          // issuance amount range proof
          address_pointer = CopyVariableBuffer(
              input->issuance_amount_rangeproof,
              input->issuance_amount_rangeproof_len, address_pointer);
          // inflation keys range proof
          address_pointer = CopyVariableBuffer(
              input->inflation_keys_rangeproof,
              input->inflation_keys_rangeproof_len, address_pointer);
          // witness
          size_t num_items = input->witness ? input->witness->num_items : 0;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
          // pegin_witness
          num_items = 0;
          if (input->pegin_witness)
            num_items = input->pegin_witness->num_items;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->pegin_witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
        }

        for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
          const struct wally_tx_output *output = tx_pointer->outputs + i;
          // surjection proof
          address_pointer = CopyVariableBuffer(
              output->surjectionproof, output->surjectionproof_len,
              address_pointer);
          // range proof
          address_pointer = CopyVariableBuffer(
              output->rangeproof, output->rangeproof_len, address_pointer);
        }
      }

      unsigned char *start_address = buffer.data();
      size = address_pointer - start_address;
      if (buffer.size() > size) {
        buffer.resize(size);
        info(CFD_LOG_SOURCE, "set buffer size[{}]", size);
      }
    } else {
      warn(
          CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}]. in/out={}/{}", ret,
          tx_pointer->num_inputs, tx_pointer->num_outputs);
      throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
    }
  } else if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
  }

  return ByteData(buffer);
}